

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O3

void __thiscall
EdExplFinder::debug_print(EdExplFinder *this,vector<int,_std::allocator<int>_> *shortestPathMatrix)

{
  bool bVar1;
  undefined8 in_RAX;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *__format;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***************************************************************"
             ,0x3f);
  uStack_38._0_4_ = CONCAT13(10,(undefined3)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)((long)&uStack_38 + 3),1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"shortest path matrix:",0x15);
  uStack_38._0_5_ = CONCAT14(10,(undefined4)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)((long)&uStack_38 + 4),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
  if (-1 < this->seqSize) {
    uVar2 = 0xffffffff;
    do {
      uVar2 = uVar2 + 1;
      printf("%2d ",(ulong)uVar2);
    } while ((int)uVar2 < this->seqSize);
  }
  uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)((long)&uStack_38 + 5),1);
  if (-2 < this->seqSize) {
    iVar3 = -1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---",3);
      iVar3 = iVar3 + 1;
    } while (iVar3 <= this->seqSize);
  }
  uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)((long)&uStack_38 + 6),1);
  iVar3 = this->seqSize;
  if (-1 < iVar3) {
    uVar7 = 0;
    do {
      iVar6 = (int)uVar7;
      if (-2 < iVar3) {
        iVar5 = -1;
        do {
          if (iVar5 == -1) {
            __format = "%2d|";
            uVar4 = uVar7;
          }
          else {
            __format = "%2d ";
            uVar4 = (ulong)(uint)(shortestPathMatrix->super__Vector_base<int,_std::allocator<int>_>)
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [(iVar3 + 1) * iVar6 + iVar5];
          }
          printf(__format,uVar4);
          iVar3 = this->seqSize;
          bVar1 = iVar5 < iVar3;
          iVar5 = iVar5 + 1;
        } while (bVar1);
      }
      uStack_38._0_3_ = CONCAT12(10,(undefined2)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 2),1);
      iVar3 = this->seqSize;
      uVar7 = (ulong)(iVar6 + 1);
    } while (iVar6 < iVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***************************************************************"
             ,0x3f);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void EdExplFinder::debug_print(std::vector<int>* shortestPathMatrix) const {
	std::cout << "***************************************************************" << '\n';

	std::cout << "shortest path matrix:" << '\n';

	std::cout << "   ";
	for (int i = 0; i < seqSize + 1; i++) {
		printf("%2d ", i);
	}
	std::cout << '\n';

	for (int i = 0; i < seqSize + 2; i++) {
		std::cout << "---";
	}
	std::cout << '\n';

	for (int i = 0; i < seqSize + 1; i++) {
		for (int j = -1; j < seqSize + 1; j++) {
			if (j == -1) {
				printf("%2d|", i);
			} else {
				printf("%2d ", (*shortestPathMatrix)[matrixCoord(i, j)]);
			}
		}
		std::cout << '\n';
	}

	std::cout << "***************************************************************" << '\n';
}